

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# corner_table.cc
# Opt level: O2

void __thiscall draco::CornerTable::UpdateFaceToVertexMap(CornerTable *this,VertexIndex vertex)

{
  VertexCornersIterator<draco::CornerTable> it;
  VertexCornersIterator<draco::CornerTable> local_30;
  
  local_30.start_corner_.value_ =
       (this->vertex_corners_).vector_.
       super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
       ._M_impl.super__Vector_impl_data._M_start[vertex.value_].value_;
  local_30.left_traversal_ = true;
  local_30.corner_table_ = this;
  local_30.corner_.value_ = local_30.start_corner_.value_;
  while (local_30.corner_.value_ != 0xffffffff) {
    (this->corner_to_vertex_map_).vector_.
    super__Vector_base<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>_>
    ._M_impl.super__Vector_impl_data._M_start[local_30.corner_.value_].value_ = vertex.value_;
    VertexCornersIterator<draco::CornerTable>::Next(&local_30);
  }
  return;
}

Assistant:

void CornerTable::UpdateFaceToVertexMap(const VertexIndex vertex) {
  DRACO_DCHECK(GetValenceCache().IsCacheEmpty());
  VertexCornersIterator<CornerTable> it(this, vertex);
  for (; !it.End(); ++it) {
    const CornerIndex corner = *it;
    corner_to_vertex_map_[corner] = vertex;
  }
}